

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
gl4cts::TextureFilterMinmaxUtils::getDataFromTexture
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          TextureFilterMinmaxUtils *this,RenderContext *context,GLuint textureId,IVec2 *textureSize,
          GLenum format,GLenum type)

{
  int iVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  long lVar4;
  
  iVar2 = (*context->_vptr_RenderContext[3])(context);
  lVar4 = CONCAT44(extraout_var,iVar2);
  iVar2 = textureSize->m_data[1];
  iVar1 = textureSize->m_data[0];
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (__return_storage_ptr__,(long)(iVar2 * iVar1));
  (**(code **)(lVar4 + 0xb8))(0xde1,textureId);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"bindTexture error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x1de);
  (**(code **)(lVar4 + 0xaa0))
            (0xde1,0,format,type,
             (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"getTexImage error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x1e1);
  return __return_storage_ptr__;
}

Assistant:

std::vector<glw::GLuint> TextureFilterMinmaxUtils::getDataFromTexture(const glu::RenderContext& context,
																	  glw::GLuint textureId, tcu::IVec2 textureSize,
																	  glw::GLenum format, glw::GLenum type)
{
	const glw::Functions& gl = context.getFunctions();

	glw::GLsizei imageLength = textureSize.x() * textureSize.y();

	std::vector<glw::GLuint> data;
	data.resize(imageLength);

	gl.bindTexture(GL_TEXTURE_2D, textureId);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bindTexture error occurred");

	gl.getTexImage(GL_TEXTURE_2D, 0, format, type, &data[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getTexImage error occurred");

	return data;
}